

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O2

void eclmap_load(uint version,eclmap_t *emap,FILE *f,char *fn)

{
  state_t state;
  state_t local_38;
  
  local_38.emap = emap;
  local_38.fn = fn;
  control(&local_38,0,"!ins_names");
  seqmap_load("!eclmap",&local_38,set,control,f,fn);
  return;
}

Assistant:

void
eclmap_load(
    unsigned int version,
    eclmap_t* emap,
    FILE* f,
    const char* fn)
{
    (void)version;
    state_t state;
    state.emap = emap;
    state.fn = fn;
    control(&state, 0, "!ins_names"); // default section
    seqmap_load("!eclmap", &state, (seqmap_setfunc_t)set, (seqmap_controlfunc_t)control, f, fn);
}